

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2SOImm(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  byte bVar1;
  uint uVar2;
  DecodeStatus extraout_EAX;
  
  if ((Val & 0xc00) == 0) {
    uVar2 = Val & 0xff;
    switch(Val >> 8 & 3) {
    case 1:
      uVar2 = uVar2 | uVar2 << 0x10;
      break;
    case 2:
      uVar2 = uVar2 * 0x1000100;
      break;
    case 3:
      uVar2 = uVar2 * 0x1010101;
    }
  }
  else {
    uVar2 = Val & 0xff | 0x80;
    bVar1 = (byte)(Val >> 7) & 0x1f;
    uVar2 = uVar2 >> bVar1 | uVar2 << 0x20 - bVar1;
  }
  MCOperand_CreateImm0(Inst,(ulong)uVar2);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeT2SOImm(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	unsigned ctrl = fieldFromInstruction_4(Val, 10, 2);
	if (ctrl == 0) {
		unsigned byte = fieldFromInstruction_4(Val, 8, 2);
		unsigned imm = fieldFromInstruction_4(Val, 0, 8);
		switch (byte) {
			case 0:
				MCOperand_CreateImm0(Inst, imm);
				break;
			case 1:
				MCOperand_CreateImm0(Inst, (imm << 16) | imm);
				break;
			case 2:
				MCOperand_CreateImm0(Inst, (imm << 24) | (imm << 8));
				break;
			case 3:
				MCOperand_CreateImm0(Inst, (imm << 24) | (imm << 16) | (imm << 8)  |  imm);
				break;
		}
	} else {
		unsigned unrot = fieldFromInstruction_4(Val, 0, 7) | 0x80;
		unsigned rot = fieldFromInstruction_4(Val, 7, 5);
		unsigned imm = (unrot >> rot) | (unrot << ((32-rot)&31));
		MCOperand_CreateImm0(Inst, imm);
	}

	return MCDisassembler_Success;
}